

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_member_cmp_equal(asmcode *code,compiler_options *param_2)

{
  operand oVar1;
  operation oVar2;
  operation local_40;
  operand local_3c;
  operand local_38 [2];
  
  local_40 = LABEL;
  assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[27]>
            (code,&local_40,(char (*) [27])"L_compile_member_cmp_equal");
  oVar2 = PUSH;
  local_40 = oVar2;
  local_3c = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_40,&local_3c);
  oVar1 = R15;
  local_40 = oVar2;
  local_3c = oVar1;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_40,&local_3c);
  local_3c = RAX;
  local_40 = oVar2;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_40,&local_3c);
  oVar2 = MOV;
  local_40 = oVar2;
  local_3c = R11;
  local_38[0] = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_40,&local_3c,local_38);
  local_38[0] = LABELADDRESS;
  local_40 = oVar2;
  local_3c = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,char_const(&)[20]>
            (code,&local_40,&local_3c,local_38,(char (*) [20])"L_recursively_equal");
  local_40 = CALL;
  local_3c = oVar1;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_40,&local_3c);
  oVar1 = R11;
  local_38[0] = NUMBER;
  local_38[1] = 0xf;
  local_40 = oVar2;
  local_3c = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_40,&local_3c,local_38,(int *)(local_38 + 1));
  local_40 = CMP;
  local_3c = RAX;
  local_38[0] = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_40,&local_3c,local_38);
  oVar2 = POP;
  local_40 = oVar2;
  local_3c = RAX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_40,&local_3c);
  local_3c = R15;
  local_40 = oVar2;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_40,&local_3c);
  local_40 = oVar2;
  local_3c = oVar1;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_40,&local_3c);
  local_40 = RET;
  assembler::asmcode::add<assembler::asmcode::operation>(code,&local_40);
  return;
}

Assistant:

void compile_member_cmp_equal(asmcode& code, const compiler_options&)
  {
  // this method gets its arguments in rax and r15, and sets the Z flag
  code.add(asmcode::LABEL, "L_compile_member_cmp_equal");
  code.add(asmcode::PUSH, asmcode::R11);
  code.add(asmcode::PUSH, asmcode::R15);
  code.add(asmcode::PUSH, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::R15);
  code.add(asmcode::MOV, asmcode::R15, asmcode::LABELADDRESS, "L_recursively_equal");
  code.add(asmcode::CALL, asmcode::R15);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, bool_t);
  code.add(asmcode::CMP, asmcode::RAX, asmcode::R11);
  code.add(asmcode::POP, asmcode::RAX);
  code.add(asmcode::POP, asmcode::R15);
  code.add(asmcode::POP, asmcode::R11);
  code.add(asmcode::RET);
  }